

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pred_common.c
# Opt level: O0

int av1_get_reference_mode_context(MACROBLOCKD *xd)

{
  MB_MODE_INFO *mbmi;
  byte bVar1;
  byte bVar2;
  int iVar3;
  long in_RDI;
  MB_MODE_INFO *edge_mbmi;
  int has_left;
  int has_above;
  MB_MODE_INFO *left_mbmi;
  MB_MODE_INFO *above_mbmi;
  int ctx;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  bool bVar4;
  MB_MODE_INFO *local_48;
  byte local_3a;
  byte local_39;
  bool local_32;
  bool local_31;
  uint local_c;
  
  mbmi = *(MB_MODE_INFO **)(in_RDI + 0x1ed0);
  local_48 = *(MB_MODE_INFO **)(in_RDI + 0x1ec8);
  bVar1 = *(byte *)(in_RDI + 0x1ec0) & 1;
  bVar2 = *(byte *)(in_RDI + 0x1ec1) & 1;
  if ((bVar1 == 0) || (bVar2 == 0)) {
    if ((bVar1 == 0) && (bVar2 == 0)) {
      local_c = 1;
    }
    else {
      if (bVar1 != 0) {
        local_48 = mbmi;
      }
      iVar3 = has_second_ref(local_48);
      if (iVar3 == 0) {
        bVar4 = false;
        if ('\x04' < local_48->ref_frame[0]) {
          bVar4 = local_48->ref_frame[0] < '\b';
        }
        local_c = (uint)bVar4;
      }
      else {
        local_c = 3;
      }
    }
  }
  else {
    iVar3 = has_second_ref(mbmi);
    if ((iVar3 == 0) && (iVar3 = has_second_ref(local_48), iVar3 == 0)) {
      local_31 = false;
      if ('\x04' < mbmi->ref_frame[0]) {
        local_31 = mbmi->ref_frame[0] < '\b';
      }
      local_32 = false;
      if ('\x04' < local_48->ref_frame[0]) {
        local_32 = local_48->ref_frame[0] < '\b';
      }
      local_c = (uint)(byte)(local_31 ^ local_32);
    }
    else {
      iVar3 = has_second_ref(mbmi);
      if (iVar3 == 0) {
        if ((mbmi->ref_frame[0] < '\x05') || (local_39 = 1, '\a' < mbmi->ref_frame[0])) {
          iVar3 = is_inter_block((MB_MODE_INFO *)
                                 CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
          local_39 = iVar3 != 0 ^ 0xff;
        }
        local_c = (local_39 & 1) + 2;
      }
      else {
        iVar3 = has_second_ref(local_48);
        if (iVar3 == 0) {
          if ((local_48->ref_frame[0] < '\x05') || (local_3a = 1, '\a' < local_48->ref_frame[0])) {
            iVar3 = is_inter_block((MB_MODE_INFO *)
                                   CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
            local_3a = iVar3 != 0 ^ 0xff;
          }
          local_c = (local_3a & 1) + 2;
        }
        else {
          local_c = 4;
        }
      }
    }
  }
  return local_c;
}

Assistant:

int av1_get_reference_mode_context(const MACROBLOCKD *xd) {
  int ctx;
  const MB_MODE_INFO *const above_mbmi = xd->above_mbmi;
  const MB_MODE_INFO *const left_mbmi = xd->left_mbmi;
  const int has_above = xd->up_available;
  const int has_left = xd->left_available;

  // Note:
  // The mode info data structure has a one element border above and to the
  // left of the entries corresponding to real macroblocks.
  // The prediction flags in these dummy entries are initialized to 0.
  if (has_above && has_left) {  // both edges available
    if (!has_second_ref(above_mbmi) && !has_second_ref(left_mbmi))
      // neither edge uses comp pred (0/1)
      ctx = IS_BACKWARD_REF_FRAME(above_mbmi->ref_frame[0]) ^
            IS_BACKWARD_REF_FRAME(left_mbmi->ref_frame[0]);
    else if (!has_second_ref(above_mbmi))
      // one of two edges uses comp pred (2/3)
      ctx = 2 + (IS_BACKWARD_REF_FRAME(above_mbmi->ref_frame[0]) ||
                 !is_inter_block(above_mbmi));
    else if (!has_second_ref(left_mbmi))
      // one of two edges uses comp pred (2/3)
      ctx = 2 + (IS_BACKWARD_REF_FRAME(left_mbmi->ref_frame[0]) ||
                 !is_inter_block(left_mbmi));
    else  // both edges use comp pred (4)
      ctx = 4;
  } else if (has_above || has_left) {  // one edge available
    const MB_MODE_INFO *edge_mbmi = has_above ? above_mbmi : left_mbmi;

    if (!has_second_ref(edge_mbmi))
      // edge does not use comp pred (0/1)
      ctx = IS_BACKWARD_REF_FRAME(edge_mbmi->ref_frame[0]);
    else
      // edge uses comp pred (3)
      ctx = 3;
  } else {  // no edges available (1)
    ctx = 1;
  }
  assert(ctx >= 0 && ctx < COMP_INTER_CONTEXTS);
  return ctx;
}